

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
 __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::
getVariants<Kernel::Literal*>
          (SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *this,Literal *query,
          bool retrieveSubstitutions)

{
  int *piVar1;
  long *plVar2;
  Node *root;
  int iVar3;
  void **head;
  RenamingSubstitution *this_00;
  RefCounter *pRVar4;
  Literal *pLVar5;
  Leaf *pLVar6;
  int in_ECX;
  undefined7 in_register_00000011;
  RenamingSubstitution *pRVar7;
  void **head_2;
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  svBindings;
  ResultSubstitutionSP resultSubst;
  long *local_a8;
  long *local_a0;
  anon_class_32_3_b6b1deac_for__func local_98;
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_78;
  RenamingSubstitution *local_68;
  RefCounter *pRStack_60;
  IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:656:16),_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
  local_58;
  
  pLVar5 = (Literal *)CONCAT71(in_register_00000011,retrieveSubstitutions);
  if (in_ECX == 0) {
    local_68 = (RenamingSubstitution *)0x0;
    pRStack_60 = (RefCounter *)0x0;
    this_00 = (RenamingSubstitution *)0x0;
    pLVar5 = Kernel::Renaming::normalize(pLVar5);
    pRVar4 = (RefCounter *)0x0;
  }
  else {
    this_00 = (RenamingSubstitution *)::operator_new(0x28);
    RenamingSubstitution::RenamingSubstitution(this_00);
    local_68 = this_00;
    pRVar4 = (RefCounter *)
             Lib::FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    pRVar4->_val = 1;
    pRStack_60 = pRVar4;
    Kernel::Renaming::normalizeVariables
              ((this_00->_query)._self._M_t.
               super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>._M_t.
               super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>.
               super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl,pLVar5);
    pLVar5 = Kernel::Renaming::apply
                       ((this_00->_query)._self._M_t.
                        super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>
                        .super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl,pLVar5);
  }
  Lib::
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_78);
  createBindings<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getVariants<Kernel::Literal*>(Kernel::Literal*,bool)::_lambda(auto:1,auto:2)_1_>
            ((SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *)query,pLVar5,false,
             &local_78);
  root = *(Node **)&(query->super_Term)._functor;
  if (root != (Node *)0x0) {
    pLVar6 = findLeaf((SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *)query,root,
                      (BindingMap *)
                      local_78._self._M_t.
                      super___uniq_ptr_impl<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_*,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_>_>
                      .
                      super__Head_base<0UL,_Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_*,_false>
                      ._M_head_impl);
    if (pLVar6 != (Leaf *)0x0) {
      (*(pLVar6->super_Node)._vptr_Node[8])(&local_a0,pLVar6);
      if (local_a0 == (long *)0x0) {
        local_a8 = (long *)0x0;
      }
      else {
        local_a8 = local_a0;
        iVar3 = (int)local_a0[1] + 1;
        *(int *)(local_a0 + 1) = iVar3;
        if (iVar3 == 0) {
          (**(code **)(*local_a0 + 8))();
        }
      }
      local_98.retrieveSubstitutions = SUB41(in_ECX,0);
      if (pRVar4 != (RefCounter *)0x0 && this_00 != (RenamingSubstitution *)0x0) {
        pRVar4->_val = pRVar4->_val + 1;
      }
      local_98.renaming._M_t.
      super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
      .
      super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>,_true,_true>
            )(__uniq_ptr_data<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>,_true,_true>
              )this_00;
      local_98.resultSubst._obj = &this_00->super_ResultSubstitution;
      local_98.resultSubst._refCnt = pRVar4;
      Lib::IterTraits<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs*>>::
      map<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getVariants<Kernel::Literal*>(Kernel::Literal*,bool)::_lambda(Inferences::ALASCA::BinaryResolutionConf::Rhs*)_1_>
                (&local_58,&local_a8,&local_98);
      Lib::
      pvi<Lib::IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs*>,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getVariants<Kernel::Literal*>(Kernel::Literal*,bool)::_lambda(Inferences::ALASCA::BinaryResolutionConf::Rhs*)_1_,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>>>
                ((Lib *)this,&local_58);
      if (local_58._iter._inner._core !=
          (IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Rhs_*> *)0x0) {
        piVar1 = &(local_58._iter._inner._core)->_refCnt;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*(local_58._iter._inner._core)->_vptr_IteratorCore[1])();
        }
      }
      if (((local_58._iter._func.resultSubst._obj != (ResultSubstitution *)0x0) &&
          (local_58._iter._func.resultSubst._refCnt != (RefCounter *)0x0)) &&
         ((local_58._iter._func.resultSubst._refCnt)->_val =
               (local_58._iter._func.resultSubst._refCnt)->_val + -1,
         (local_58._iter._func.resultSubst._refCnt)->_val == 0)) {
        (*(local_58._iter._func.resultSubst._obj)->_vptr_ResultSubstitution[1])();
        if (local_58._iter._func.resultSubst._refCnt != (RefCounter *)0x0) {
          *(undefined8 *)local_58._iter._func.resultSubst._refCnt =
               Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_58._iter._func.resultSubst._refCnt;
        }
      }
      if (local_58._iter._func.renaming._M_t.
          super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
          ._M_t.
          super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
          .
          super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_false>
          ._M_head_impl !=
          (__uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
           )0x0) {
        (*((ResultSubstitution *)
          local_58._iter._func.renaming._M_t.
          super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
          ._M_t.
          super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
          .
          super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_false>
          ._M_head_impl)->_vptr_ResultSubstitution[1])();
      }
      local_58._iter._func.renaming._M_t.
      super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
      .
      super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>,_true,_true>
            )(__uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
              )0x0;
      if ((((RenamingSubstitution *)local_98.resultSubst._obj != (RenamingSubstitution *)0x0) &&
          (local_98.resultSubst._refCnt != (RefCounter *)0x0)) &&
         ((local_98.resultSubst._refCnt)->_val = (local_98.resultSubst._refCnt)->_val + -1,
         (local_98.resultSubst._refCnt)->_val == 0)) {
        (*((ResultSubstitution *)&(local_98.resultSubst._obj)->_vptr_ResultSubstitution)->
          _vptr_ResultSubstitution[1])();
        if (local_98.resultSubst._refCnt != (RefCounter *)0x0) {
          *(undefined8 *)local_98.resultSubst._refCnt = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_98.resultSubst._refCnt;
        }
      }
      if (local_98.renaming._M_t.
          super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
          ._M_t.
          super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
          .
          super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_false>
          ._M_head_impl !=
          (__uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
           )0x0) {
        (*((ResultSubstitution *)
          local_98.renaming._M_t.
          super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
          ._M_t.
          super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
          .
          super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_false>
          ._M_head_impl)->_vptr_ResultSubstitution[1])();
      }
      local_98.renaming._M_t.
      super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
      .
      super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>,_true,_true>
            )(__uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
              )0x0;
      if (local_a8 != (long *)0x0) {
        plVar2 = local_a8 + 1;
        *(int *)plVar2 = (int)*plVar2 + -1;
        if ((int)*plVar2 == 0) {
          (**(code **)(*local_a8 + 8))();
        }
      }
      if (local_a0 != (long *)0x0) {
        plVar2 = local_a0 + 1;
        *(int *)plVar2 = (int)*plVar2 + -1;
        if ((int)*plVar2 == 0) {
          (**(code **)(*local_a0 + 8))();
        }
      }
      pRVar7 = (RenamingSubstitution *)0x0;
      goto LAB_0036e7b5;
    }
  }
  Lib::
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
  ::getEmpty();
  pRVar7 = this_00;
LAB_0036e7b5:
  Lib::
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_78);
  if ((pRVar4 != (RefCounter *)0x0 && this_00 != (RenamingSubstitution *)0x0) &&
     (pRVar4->_val = pRVar4->_val + -1, pRVar4->_val == 0)) {
    (*(this_00->super_ResultSubstitution)._vptr_ResultSubstitution[1])(this_00);
    *(undefined8 *)pRVar4 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pRVar4;
  }
  if (pRVar7 != (RenamingSubstitution *)0x0) {
    (*(pRVar7->super_ResultSubstitution)._vptr_ResultSubstitution[1])(pRVar7);
  }
  return (VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
          )(IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
            *)this;
}

Assistant:

VirtualIterator<QueryRes<ResultSubstitutionSP, LeafData>> getVariants(Query query, bool retrieveSubstitutions)
    {
      auto renaming = retrieveSubstitutions ? std::make_unique<RenamingSubstitution>() : std::unique_ptr<RenamingSubstitution>(nullptr);
      ResultSubstitutionSP resultSubst = retrieveSubstitutions ? ResultSubstitutionSP(&*renaming) : ResultSubstitutionSP();

      Query normQuery;
      if (retrieveSubstitutions) {
        renaming->_query->normalizeVariables(query);
        normQuery = renaming->_query->apply(query);
      } else {
        normQuery = Renaming::normalize(query);
      }

      Recycled<BindingMap> svBindings;
      createBindings(normQuery, /* reversed */ false,
          [&](auto v, auto t) { {
            svBindings->insert(v, t);
          } });
      Leaf* leaf = findLeaf(*svBindings);
      if(leaf==0) {
        return VirtualIterator<QueryRes<ResultSubstitutionSP, LeafData>>::getEmpty();
      } else {
        return pvi(iterTraits(leaf->allChildren())
          .map([retrieveSubstitutions, renaming = std::move(renaming), resultSubst](LeafData* ld) 
            {
              ResultSubstitutionSP subs;
              if (retrieveSubstitutions) {
                renaming->_result->reset();
                renaming->_result->normalizeVariables(ld->key());
                subs = resultSubst;
              }
              return QueryRes(subs, ld);
            }));
      }
    }